

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec16.c
# Opt level: O2

void If_CluMoveVar(word *pF,int nVars,int *Var2Pla,int *Pla2Var,int v,int p)

{
  ulong *puVar1;
  bool bVar2;
  word *pIn;
  int iVar;
  word *pwVar3;
  word *pOut;
  word pG [1024];
  word local_2038 [1025];
  
  if ((v < 0) || (nVars <= v)) {
    __assert_fail("v >= 0 && v < nVars",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec16.c"
                  ,0x336,"void If_CluMoveVar(word *, int, int *, int *, int, int)");
  }
  bVar2 = false;
  pwVar3 = pF;
  pOut = local_2038;
  while (pIn = pwVar3, iVar = Var2Pla[(uint)v], iVar < p) {
    If_CluSwapAdjacent(pOut,pIn,iVar,nVars);
    Var2Pla[Pla2Var[iVar]] = Var2Pla[Pla2Var[iVar]] + 1;
    Var2Pla[Pla2Var[(long)iVar + 1]] = Var2Pla[Pla2Var[(long)iVar + 1]] + -1;
    *(ulong *)(Pla2Var + iVar) =
         CONCAT44((int)*(undefined8 *)(Pla2Var + iVar),
                  (int)((ulong)*(undefined8 *)(Pla2Var + iVar) >> 0x20));
    bVar2 = (bool)(bVar2 ^ 1);
    pwVar3 = pOut;
    pOut = pIn;
  }
  while (pwVar3 = pIn, p < iVar) {
    If_CluSwapAdjacent(pOut,pwVar3,iVar + -1,nVars);
    Var2Pla[Pla2Var[(long)iVar + -1]] = Var2Pla[Pla2Var[(long)iVar + -1]] + 1;
    Var2Pla[Pla2Var[iVar]] = Var2Pla[Pla2Var[iVar]] + -1;
    puVar1 = (ulong *)(Pla2Var + (long)iVar + -1);
    *puVar1 = *puVar1 << 0x20 | *puVar1 >> 0x20;
    bVar2 = (bool)(bVar2 ^ 1);
    pIn = pOut;
    pOut = pwVar3;
    iVar = Var2Pla[(uint)v];
  }
  if (bVar2) {
    If_CluCopy(pF,pwVar3,nVars);
  }
  if (Pla2Var[p] == v) {
    return;
  }
  __assert_fail("Pla2Var[p] == v",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec16.c"
                ,0x353,"void If_CluMoveVar(word *, int, int *, int *, int, int)");
}

Assistant:

void If_CluMoveVar( word * pF, int nVars, int * Var2Pla, int * Pla2Var, int v, int p )
{
    word pG[CLU_WRD_MAX], * pIn = pF, * pOut = pG, * pTemp;
    int iPlace0, iPlace1, Count = 0;
    assert( v >= 0 && v < nVars );
    while ( Var2Pla[v] < p )
    {
        iPlace0 = Var2Pla[v];
        iPlace1 = Var2Pla[v]+1;
        If_CluSwapAdjacent( pOut, pIn, iPlace0, nVars );
        pTemp = pIn; pIn = pOut, pOut = pTemp;
        Var2Pla[Pla2Var[iPlace0]]++;
        Var2Pla[Pla2Var[iPlace1]]--;
        Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
        Pla2Var[iPlace1] ^= Pla2Var[iPlace0];
        Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
        Count++;
    }
    while ( Var2Pla[v] > p )
    {
        iPlace0 = Var2Pla[v]-1;
        iPlace1 = Var2Pla[v];
        If_CluSwapAdjacent( pOut, pIn, iPlace0, nVars );
        pTemp = pIn; pIn = pOut, pOut = pTemp;
        Var2Pla[Pla2Var[iPlace0]]++;
        Var2Pla[Pla2Var[iPlace1]]--;
        Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
        Pla2Var[iPlace1] ^= Pla2Var[iPlace0];
        Pla2Var[iPlace0] ^= Pla2Var[iPlace1];
        Count++;
    }
    if ( Count & 1 )
        If_CluCopy( pF, pIn, nVars );
    assert( Pla2Var[p] == v );
}